

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O2

void __thiscall
Diligent::HashMapStringKey::HashMapStringKey(HashMapStringKey *this,Char *_Str,bool bMakeCopy)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  Char *__dest;
  string msg;
  string local_50;
  
  this->Str = _Str;
  this->Ownership_Hash = 0;
  if (_Str == (Char *)0x0) {
    FormatString<char[32]>(&local_50,(char (*) [32])"String pointer must not be null");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"HashMapStringKey",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/HashUtils.hpp"
               ,0xec);
    std::__cxx11::string::~string((string *)&local_50);
    _Str = this->Str;
  }
  sVar1 = CStringHash<char>::operator()((CStringHash<char> *)&local_50,_Str);
  this->Ownership_Hash = sVar1 & 0x7fffffffffffffff;
  if (bMakeCopy) {
    __s = this->Str;
    sVar2 = strlen(__s);
    __dest = (Char *)operator_new__(sVar2 + 1);
    memcpy(__dest,__s,sVar2 + 1);
    this->Str = __dest;
    this->Ownership_Hash = sVar1 | 0x8000000000000000;
  }
  return;
}

Assistant:

HashMapStringKey(const Char* _Str, bool bMakeCopy = false) :
        Str{_Str}
    {
        VERIFY(Str, "String pointer must not be null");

        Ownership_Hash = CStringHash<Char>{}.operator()(Str) & HashMask;
        if (bMakeCopy)
        {
            auto  LenWithZeroTerm = strlen(Str) + 1;
            auto* StrCopy         = new char[LenWithZeroTerm];
            std::memcpy(StrCopy, Str, LenWithZeroTerm);
            Str = StrCopy;
            Ownership_Hash |= StrOwnershipMask;
        }
    }